

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::section::Type<32,151>::
LimitedCovarianceBase<njoy::ENDFtk::section::Type<32,151>::LimitedMultiLevelBreitWigner>::
print<std::back_insert_iterator<std::__cxx11::string>>
          (LimitedCovarianceBase<njoy::ENDFtk::section::Type<32,151>::LimitedMultiLevelBreitWigner>
           *this,back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *it,int MAT,int MF,int MT)

{
  undefined1 auVar1 [16];
  ListRecord *pLVar2;
  LimitedBreitWignerLValue *lvalue;
  ListRecord *this_00;
  undefined1 local_68 [56];
  
  local_68._8_8_ =
       SEXT48((int)((ulong)(*(long *)(this + 0x28) - *(long *)(this + 0x20)) >> 3) * 0x38e38e39);
  local_68._1_7_ = 0;
  local_68[0] = this[0x18];
  local_68._16_8_ = 0;
  local_68._24_8_ = 0;
  auVar1 = *(undefined1 (*) [16])this;
  local_68._40_4_ = auVar1._0_4_;
  local_68._32_8_ = auVar1._8_8_;
  local_68._44_4_ = auVar1._4_4_;
  ControlRecord::print<std::back_insert_iterator<std::__cxx11::string>>
            ((ControlRecord *)local_68,it,MAT,MF,MT);
  if (this[0x18] ==
      (LimitedCovarianceBase<njoy::ENDFtk::section::Type<32,151>::LimitedMultiLevelBreitWigner>)0x1)
  {
    if (this[0x18] ==
        (LimitedCovarianceBase<njoy::ENDFtk::section::Type<32,151>::LimitedMultiLevelBreitWigner>)
        0x0) {
      std::__throw_bad_optional_access();
    }
    local_68._16_8_ = 0;
    local_68._24_8_ = 0;
    local_68._0_8_ = 0;
    local_68._8_8_ = 0;
    local_68._40_8_ = 0;
    local_68._32_8_ = *(ulong *)(this + 0x10);
    ControlRecord::print<std::back_insert_iterator<std::__cxx11::string>>
              ((ControlRecord *)local_68,it,MAT,MF,MT);
  }
  pLVar2 = *(ListRecord **)(this + 0x28);
  for (this_00 = *(ListRecord **)(this + 0x20); this_00 != pLVar2; this_00 = this_00 + 1) {
    ListRecord::print<std::back_insert_iterator<std::__cxx11::string>>(this_00,it,MAT,MF,MT);
  }
  return;
}

Assistant:

void print( OutputIterator& it, int MAT, int MF, int MT ) const {

  ControlRecord( this->SPI(), this->AP(),
                 0, this->LCOMP(),
                 this->NLS(), this->ISR() ).print( it, MAT, MF, MT );
  if ( this->ISR() ) {

    ControlRecord( 0., this->DAP().value(), 0, 0, 0, 0 ).print( it, MAT, MF, MT );
  }
  for ( const auto& lvalue : this->lvalues_ ) {

    lvalue.print( it, MAT, MF, MT );
  }
}